

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

bool CPubKey::ValidSize(vector<unsigned_char,_std::allocator<unsigned_char>_> *vch)

{
  long lVar1;
  uint uVar2;
  size_type sVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  size_type in_stack_ffffffffffffffe0;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar5 = false;
  if (sVar3 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               (ulong)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    uVar2 = GetLen((uchar)((uint)in_stack_ffffffffffffffd8 >> 0x18));
    uVar4 = (ulong)uVar2;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    bVar5 = uVar4 == sVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool static ValidSize(const std::vector<unsigned char> &vch) {
      return vch.size() > 0 && GetLen(vch[0]) == vch.size();
    }